

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_phi_break(ASMState *as,RegSet blocked,RegSet blockedby,RegSet allow)

{
  int iVar1;
  uint uVar2;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  ASMState *in_RDI;
  Reg up;
  Reg down;
  RegSet candidates;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 local_20;
  
  local_20 = in_ESI & in_ECX;
  if (local_20 != 0) {
    ra_pick((ASMState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
    if ((local_20 & (in_EDX ^ 0xffffffff)) != 0) {
      local_20 = local_20 & (in_EDX ^ 0xffffffff);
    }
    uVar2 = local_20 >> 0x18 | (local_20 & 0xff0000) >> 8 | (local_20 & 0xff00) << 8 |
            local_20 << 0x18;
    iVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    ra_rename(in_RDI,in_ESI,in_EDX);
  }
  return;
}

Assistant:

static void asm_phi_break(ASMState *as, RegSet blocked, RegSet blockedby,
			  RegSet allow)
{
  RegSet candidates = blocked & allow;
  if (candidates) {  /* If this register file has candidates. */
    /* Note: the set for ra_pick cannot be empty, since each register file
    ** has some registers never allocated to PHIs.
    */
    Reg down, up = ra_pick(as, ~blocked & allow);  /* Get a free register. */
    if (candidates & ~blockedby)  /* Optimize shifts, else it's a cycle. */
      candidates = candidates & ~blockedby;
    down = rset_picktop(candidates);  /* Pick candidate PHI register. */
    ra_rename(as, down, up);  /* And rename it to the free register. */
  }
}